

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O0

void __thiscall helix::order_book::cancel(order_book *this,uint64_t order_id,uint64_t quantity)

{
  bool bVar1;
  invalid_argument *this_00;
  order *poVar2;
  iterator in_RDI;
  iterator it;
  hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_stack_ffffffffffffff28;
  hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_stack_ffffffffffffff30;
  anon_class_8_1_9b548a09 in_stack_ffffffffffffff38;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
  *local_28;
  hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
  *local_20 [4];
  
  local_20[0] = (hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
                 *)boost::multi_index::detail::
                   hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                   ::find<unsigned_long>(in_stack_ffffffffffffff28,(unsigned_long *)0x113b51);
  local_28 = (hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>
              *)boost::multi_index::detail::
                hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                ::end((hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                       *)in_stack_ffffffffffffff38.quantity);
  bVar1 = boost::multi_index::detail::operator==
                    ((hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<helix::order>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                      *)in_stack_ffffffffffffff30,
                     (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<helix::order>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                      *)in_stack_ffffffffffffff28);
  if (!bVar1) {
    boost::multi_index::detail::
    hashed_index<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,boost::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::multi_index::detail::nth_layer<1,helix::order,boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,unsigned_long,&helix::order::id>,mpl_::na,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<helix::order>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::hashed_unique_tag>
    ::modify<helix::order_book::cancel(unsigned_long,unsigned_long)::__0>
              (in_stack_ffffffffffffff30,in_RDI,in_stack_ffffffffffffff38);
    poVar2 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<helix::order>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_helix::order_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_helix::order,_long,_const_helix::order_*,_const_helix::order_&>_>
             ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<helix::order>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_helix::order_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_helix::order,_long,_const_helix::order_*,_const_helix::order_&>_>
                           *)0x113cf0);
    if (poVar2->quantity == 0) {
      remove((order_book *)in_RDI.node,(char *)local_20);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  paVar3 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"invalid order id: ",paVar3);
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff68);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::invalid_argument::invalid_argument(this_00,local_48);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void order_book::cancel(uint64_t order_id, uint64_t quantity)
{
    auto it = _orders.find(order_id);
    if (it == _orders.end()) {
        throw std::invalid_argument(std::string("invalid order id: ") + std::to_string(order_id));
    }
    _orders.modify(it, [quantity](order& order) {
        order.quantity -= quantity;
        order.level->size -= quantity;
    });
    if (!it->quantity) {
        remove(it);
    }
}